

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inherit.cc
# Opt level: O0

void QueryHandler2(string *query)

{
  bool bVar1;
  reference pbVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  LogText logger;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  LogText *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff48;
  LogText *in_stack_ffffffffffffff50;
  _Self in_stack_ffffffffffffff58;
  _Self local_a0;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  string *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string local_60 [48];
  string *in_stack_ffffffffffffffd0;
  
  LogText::LogText(in_stack_ffffffffffffff50,(InheritType)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                  );
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  LogText::Log(in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff58._M_node,(char *)in_stack_ffffffffffffff50);
  QueryHandler1(in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  local_98 = LogText::GetLines_abi_cxx11_((LogText *)0x10452d);
  local_a0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff28);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = std::operator!=(&local_a0,(_Self *)&stack0xffffffffffffff58);
    if (!bVar1) break;
    pbVar2 = std::
             _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff30);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Available from QueryHandler2: \"");
    poVar3 = std::operator<<(poVar3,(string *)pbVar2);
    in_stack_ffffffffffffff30 = (LogText *)std::operator<<(poVar3,"\"");
    std::ostream::operator<<
              ((ostream *)in_stack_ffffffffffffff30,std::endl<char,std::char_traits<char>>);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_a0);
  }
  LogText::~LogText(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void QueryHandler2(const std::string& query) {
  LogText logger(LogText::InheritType::kNew);
  LogText::Log("QueryHandler2 called: " + query);
  QueryHandler1(query + "!!!");
  for (const auto& line : logger.GetLines()) {
    std::cerr << "Available from QueryHandler2: \"" << line << "\""
              << std::endl;
  }
}